

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O2

int varinfo_set_mode(varinfo *info,char *mode)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  char *__format;
  int data;
  
  data = (int)((ulong)in_RAX >> 0x20);
  iVar2 = symtab_get_t(info->data->symtab,mode,3,&data);
  if (iVar2 == -1) {
    __format = "no mode %s\n";
  }
  else {
    iVar2 = info->data->modes[data].modeset;
    iVar1 = info->modes[iVar2];
    if (iVar1 == data || iVar1 == -1) {
      info->modes[iVar2] = data;
      return 0;
    }
    mode = info->data->modesets[iVar2].name;
    __format = "a mode from modeset %s has already been selected\n";
  }
  fprintf(_stderr,__format,mode);
  return -1;
}

Assistant:

int varinfo_set_mode(struct varinfo *info, const char *mode) {
	int data;
	if (symtab_get_t(info->data->symtab, mode, VARDATA_ST_MODE, &data) == -1) {
		fprintf(stderr, "no mode %s\n", mode);
		return -1;
	}
	int modeset = info->data->modes[data].modeset;
	if (info->modes[modeset] != -1 && info->modes[modeset] != data) {
		fprintf(stderr, "a mode from modeset %s has already been selected\n", info->data->modesets[modeset].name);
		return -1;
	}
	info->modes[modeset] = data;
	/* XXX: validate mode */
	return 0;
}